

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

void Sim_UtilAssignRandom(Sim_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  int local_28;
  int local_24;
  int k;
  int i;
  uint *pSimInfo;
  Abc_Obj_t *pNode;
  Sim_Man_t *p_local;
  
  for (local_24 = 0; iVar2 = Abc_NtkCiNum(p->pNtk), local_24 < iVar2; local_24 = local_24 + 1) {
    pAVar5 = Abc_NtkCi(p->pNtk,local_24);
    pvVar1 = p->vSim0->pArray[pAVar5->Id];
    for (local_28 = 0; local_28 < p->nSimWords; local_28 = local_28 + 1) {
      iVar2 = rand();
      iVar3 = rand();
      uVar4 = rand();
      *(uint *)((long)pvVar1 + (long)local_28 * 4) = iVar2 << 0x18 ^ iVar3 << 0xc ^ uVar4;
    }
  }
  return;
}

Assistant:

void Sim_UtilAssignRandom( Sim_Man_t * p )
{
    Abc_Obj_t * pNode;
    unsigned * pSimInfo;
    int i, k;
    // assign the random/systematic simulation info to the PIs
    Abc_NtkForEachCi( p->pNtk, pNode, i )
    {
        pSimInfo = (unsigned *)p->vSim0->pArray[pNode->Id];
        for ( k = 0; k < p->nSimWords; k++ )
            pSimInfo[k] = SIM_RANDOM_UNSIGNED;
    }
}